

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddUnate.c
# Opt level: O1

Extra_UnateInfo_t * Extra_UnateInfoCreateFromZdd(DdManager *dd,DdNode *zPairs,DdNode *bSupp)

{
  int iVar1;
  uint uVar2;
  Extra_UnateInfo_t *pEVar3;
  Extra_UnateVar_t *__s;
  void *__s_00;
  DdNode *n;
  long lVar4;
  DdNode *pDVar5;
  size_t __size;
  
  iVar1 = Extra_bddSuppSize(dd,bSupp);
  pEVar3 = (Extra_UnateInfo_t *)malloc(0x18);
  pEVar3->nVars = 0;
  pEVar3->nVarsMax = 0;
  *(undefined8 *)&pEVar3->nUnate = 0;
  pEVar3->pVars = (Extra_UnateVar_t *)0x0;
  pEVar3->nVars = iVar1;
  __s = (Extra_UnateVar_t *)malloc((long)iVar1 << 2);
  pEVar3->pVars = __s;
  memset(__s,0,(long)iVar1 << 2);
  iVar1 = dd->size;
  __size = (long)iVar1 << 2;
  __s_00 = malloc(__size);
  memset(__s_00,0,__size);
  pEVar3->nVarsMax = iVar1;
  pDVar5 = dd->one;
  if (pDVar5 != bSupp) {
    lVar4 = 0;
    do {
      __s[lVar4] = (Extra_UnateVar_t)((uint)__s[lVar4] & 0xc0000000 | bSupp->index & 0x3fffffff);
      *(int *)((long)__s_00 + (ulong)bSupp->index * 4) = (int)lVar4;
      bSupp = (bSupp->type).kids.T;
      lVar4 = lVar4 + 1;
    } while (bSupp != pDVar5);
  }
  Cudd_Ref(zPairs);
  pDVar5 = zPairs;
  if (dd->zero != zPairs) {
    do {
      n = Extra_zddSelectOneSubset(dd,pDVar5);
      Cudd_Ref(n);
      if (((n->type).kids.T != dd->one) || ((n->type).kids.E != dd->zero)) {
        __assert_fail("cuddT(zCube) == z1 && cuddE(zCube) == z0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/extrab/extraBddUnate.c"
                      ,0x104,
                      "Extra_UnateInfo_t *Extra_UnateInfoCreateFromZdd(DdManager *, DdNode *, DdNode *)"
                     );
      }
      uVar2 = 0x80000000;
      if ((n->index & 1) == 0) {
        uVar2 = 0x40000000;
      }
      __s[*(int *)((long)__s_00 + (ulong)(n->index >> 1) * 4)] =
           (Extra_UnateVar_t)
           ((uint)__s[*(int *)((long)__s_00 + (ulong)(n->index >> 1) * 4)] | uVar2);
      pEVar3->nUnate = pEVar3->nUnate + 1;
      zPairs = Cudd_zddDiff(dd,pDVar5,n);
      Cudd_Ref(zPairs);
      Cudd_RecursiveDerefZdd(dd,pDVar5);
      Cudd_RecursiveDerefZdd(dd,n);
      pDVar5 = zPairs;
    } while (zPairs != dd->zero);
  }
  Cudd_RecursiveDerefZdd(dd,zPairs);
  if (__s_00 != (void *)0x0) {
    free(__s_00);
  }
  return pEVar3;
}

Assistant:

Extra_UnateInfo_t * Extra_UnateInfoCreateFromZdd( DdManager * dd, DdNode * zPairs, DdNode * bSupp )
{
    Extra_UnateInfo_t * p;
    DdNode * bTemp, * zSet, * zCube, * zTemp;
    int * pMapVars2Nums;
    int i, nSuppSize;

    nSuppSize = Extra_bddSuppSize( dd, bSupp );

    // allocate and clean the storage for symmetry info
    p = Extra_UnateInfoAllocate( nSuppSize );

    // allocate the storage for the temporary map
    pMapVars2Nums = ABC_ALLOC( int, dd->size );
    memset( pMapVars2Nums, 0, dd->size * sizeof(int) );

    // assign the variables
    p->nVarsMax = dd->size;
    for ( i = 0, bTemp = bSupp; bTemp != b1; bTemp = cuddT(bTemp), i++ )
    {
        p->pVars[i].iVar = bTemp->index;
        pMapVars2Nums[bTemp->index] = i;
    }

    // write the symmetry info into the structure
    zSet = zPairs;   Cudd_Ref( zSet );
//    Cudd_zddPrintCover( dd, zPairs );    printf( "\n" );
    while ( zSet != z0 )
    {
        // get the next cube
        zCube  = Extra_zddSelectOneSubset( dd, zSet );    Cudd_Ref( zCube );

        // add this var to the data structure
        assert( cuddT(zCube) == z1 && cuddE(zCube) == z0 );
        if ( zCube->index & 1 ) // neg
            p->pVars[ pMapVars2Nums[zCube->index/2] ].Neg = 1;
        else
            p->pVars[ pMapVars2Nums[zCube->index/2] ].Pos = 1;
        // count the unate vars
        p->nUnate++;

        // update the cuver and deref the cube
        zSet = Cudd_zddDiff( dd, zTemp = zSet, zCube );     Cudd_Ref( zSet );
        Cudd_RecursiveDerefZdd( dd, zTemp );
        Cudd_RecursiveDerefZdd( dd, zCube );

    } // for each cube 
    Cudd_RecursiveDerefZdd( dd, zSet );
    ABC_FREE( pMapVars2Nums );
    return p;

}